

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall
CVmObjStringBuffer::equals(CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *val,int param_4)

{
  int iVar1;
  int iVar2;
  CVmObject *this_00;
  vm_strbuf_ext *pvVar3;
  vm_strbuf_ext *pvVar4;
  char *str_00;
  undefined4 in_ECX;
  int *in_RDX;
  vm_val_t *in_RDI;
  wchar_t *buf2;
  wchar_t *buf1;
  int32_t len2;
  int32_t len1;
  CVmObjStringBuffer *other;
  char *str;
  undefined4 in_stack_ffffffffffffffd8;
  
  if ((*in_RDX == 5) && (iVar2 = is_string_buffer_obj(0), iVar2 != 0)) {
    this_00 = vm_objp(0);
    pvVar3 = get_ext((CVmObjStringBuffer *)in_RDI);
    iVar2 = pvVar3->len;
    pvVar3 = get_ext((CVmObjStringBuffer *)this_00);
    iVar1 = pvVar3->len;
    pvVar3 = get_ext((CVmObjStringBuffer *)in_RDI);
    pvVar4 = get_ext((CVmObjStringBuffer *)this_00);
    if (iVar2 != iVar1) {
      return 0;
    }
    iVar2 = memcmp(pvVar3->buf,pvVar4->buf,(long)iVar2 << 2);
    return (uint)(iVar2 == 0);
  }
  str_00 = vm_val_t::get_as_string(in_RDI);
  if (str_00 != (char *)0x0) {
    iVar2 = equals_str((CVmObjStringBuffer *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),str_00);
    return iVar2;
  }
  err_throw(0);
}

Assistant:

int CVmObjStringBuffer::equals(VMG_ vm_obj_id_t self,
                               const vm_val_t *val, int /*depth*/) const
{
    /* 
     *   we can compare our contents to another string buffer, or to a
     *   regular string object 
     */
    const char *str;
    if (val->typ == VM_OBJ && is_string_buffer_obj(vmg_ val->val.obj))
    {
        /* compare the buffers character by character */
        CVmObjStringBuffer *other =
            (CVmObjStringBuffer *)vm_objp(vmg_ val->val.obj);
        int32_t len1 = get_ext()->len, len2 = other->get_ext()->len;
        const wchar_t *buf1 = get_ext()->buf, *buf2 = other->get_ext()->buf;

        /* if the lengths aren't equal, they're not equal */
        if (len1 != len2)
            return FALSE;

        /* they're equal if the contents match exactly */
        return memcmp(buf1, buf2, len1*sizeof(*buf1)) == 0;
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        /* compare to a constant string */
        return equals_str(str);
    }
    else
    {
        /* the other value isn't comparable to string */
        err_throw(VMERR_INVALID_COMPARISON);
        AFTER_ERR_THROW(return 0;)
    }
}